

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSValue js_std_file_puts(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  JSValue val1;
  JSValue obj;
  undefined1 auVar1 [16];
  FILE *__s;
  int in_ECX;
  int in_R9D;
  size_t len;
  char *str;
  int i;
  FILE *f;
  size_t *in_stack_ffffffffffffff98;
  JSContext *in_stack_ffffffffffffffa0;
  JSContext *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar2;
  int64_t in_stack_ffffffffffffffb8;
  undefined4 uStack_c;
  undefined8 local_8;
  
  __s = _stdout;
  if ((in_R9D == 0) ||
     (obj.u._4_4_ = in_stack_ffffffffffffffb4, obj.u.int32 = in_stack_ffffffffffffffb0,
     obj.tag = in_stack_ffffffffffffffb8,
     __s = (FILE *)js_std_file_get(in_stack_ffffffffffffffa8,obj), __s != (FILE *)0x0)) {
    for (iVar2 = 0; iVar2 < in_ECX; iVar2 = iVar2 + 1) {
      val1.tag._0_4_ = in_stack_ffffffffffffffb0;
      val1.u.ptr = in_stack_ffffffffffffffa8;
      val1.tag._4_4_ = iVar2;
      in_stack_ffffffffffffffa8 =
           (JSContext *)JS_ToCStringLen(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,val1);
      if (in_stack_ffffffffffffffa8 == (JSContext *)0x0) {
        local_8 = 6;
        goto LAB_0010ea54;
      }
      fwrite(in_stack_ffffffffffffffa8,1,(size_t)in_stack_ffffffffffffffa0,__s);
      JS_FreeCString((JSContext *)CONCAT44(iVar2,in_stack_ffffffffffffffb0),
                     (char *)in_stack_ffffffffffffffa8);
    }
    local_8 = 3;
  }
  else {
    local_8 = 6;
  }
LAB_0010ea54:
  auVar1._4_8_ = local_8;
  auVar1._0_4_ = uStack_c;
  auVar1._12_4_ = 0;
  return (JSValue)(auVar1 << 0x20);
}

Assistant:

static JSValue js_std_file_puts(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv, int magic)
{
    FILE *f;
    int i;
    const char *str;
    size_t len;

    if (magic == 0) {
        f = stdout;
    } else {
        f = js_std_file_get(ctx, this_val);
        if (!f)
            return JS_EXCEPTION;
    }
    
    for(i = 0; i < argc; i++) {
        str = JS_ToCStringLen(ctx, &len, argv[i]);
        if (!str)
            return JS_EXCEPTION;
        fwrite(str, 1, len, f);
        JS_FreeCString(ctx, str);
    }
    return JS_UNDEFINED;
}